

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qorderedmutexlocker_p.h
# Opt level: O0

bool QOrderedMutexLocker::relock(QBasicMutex *mtx1,QBasicMutex *mtx2)

{
  long lVar1;
  QBasicMutex *in_RSI;
  QBasicMutex *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff6;
  bool bVar2;
  less<QBasicMutex_*> in_stack_fffffffffffffff7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == in_RSI) {
    bVar2 = false;
  }
  else {
    bVar2 = std::less<QBasicMutex_*>::operator()
                      ((less<QBasicMutex_*> *)&stack0xfffffffffffffff7,in_RDI,in_RSI);
    if (bVar2) {
      QBasicMutex::lock(in_RSI);
      bVar2 = true;
    }
    else {
      bVar2 = QBasicMutex::tryLock(in_RSI);
      if (!bVar2) {
        QBasicMutex::unlock((QBasicMutex *)
                            CONCAT17(in_stack_fffffffffffffff7,
                                     CONCAT16(in_stack_fffffffffffffff6,in_stack_fffffffffffffff0)))
        ;
        QBasicMutex::lock(in_RSI);
        QBasicMutex::lock(in_RSI);
      }
      bVar2 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool relock(QBasicMutex *mtx1, QBasicMutex *mtx2)
    {
        // mtx1 is already locked, mtx2 not... do we need to unlock and relock?
        if (mtx1 == mtx2)
            return false;
        if (std::less<QBasicMutex *>()(mtx1, mtx2)) {
            mtx2->lock();
            return true;
        }
        if (!mtx2->tryLock()) {
            mtx1->unlock();
            mtx2->lock();
            mtx1->lock();
        }
        return true;
    }